

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int ObjNum;
  Vec_Int_t *vFrame;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 != 0) {
    piVar2 = Saig_ManBmcMapping(p,pObj);
    if (piVar2 == (int *)0x0) {
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x36d,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
  }
  pVVar3 = p->vId2Num;
  iVar1 = Aig_ObjId(pObj);
  iVar1 = Vec_IntEntry(pVVar3,iVar1);
  if (-1 < iVar1) {
    pVVar3 = (Vec_Int_t *)Vec_PtrEntry(p->vId2Var,iFrame);
    if (pVVar3 != (Vec_Int_t *)0x0) {
      iVar1 = Vec_IntEntry(pVVar3,iVar1);
      return iVar1;
    }
    __assert_fail("vFrame != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                  ,0x371,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
  }
  __assert_fail("ObjNum >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                ,0x36f,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline int Saig_ManBmcLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    assert( ObjNum >= 0 );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    assert( vFrame != NULL );
    return Vec_IntEntry( vFrame, ObjNum );
}